

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O3

Vec_Int_t * Llb_ManDeriveConstraints(Aig_Man_t *p)

{
  int *__ptr;
  int i;
  DdManager *dd;
  Vec_Int_t *vNodes;
  long lVar1;
  int Counter;
  int iVar2;
  long lVar3;
  
  if (p->nTruePos != 1) {
    printf("The AIG has %d property outputs.\n");
    return (Vec_Int_t *)0x0;
  }
  dd = Llb_ManConstructGlobalBdds(p);
  vNodes = Llb_ManComputeBaseCase(p,dd);
  lVar3 = (long)vNodes->nSize;
  __ptr = vNodes->pArray;
  if (lVar3 < 1) {
    if (__ptr != (int *)0x0) {
LAB_00941701:
      free(__ptr);
    }
    free(vNodes);
  }
  else {
    lVar1 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)((uint)__ptr[lVar1] < 2);
      lVar1 = lVar1 + 1;
    } while (lVar3 != lVar1);
    if (iVar2 != 0) {
      Llb_ManComputeIndCase(p,dd,vNodes);
    }
    lVar1 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)((uint)__ptr[lVar1] < 2);
      lVar1 = lVar1 + 1;
    } while (lVar3 != lVar1);
    if (iVar2 != 0) goto LAB_00941714;
    if (vNodes != (Vec_Int_t *)0x0) goto LAB_00941701;
  }
  vNodes = (Vec_Int_t *)0x0;
LAB_00941714:
  Llb_ManDerefenceBdds(p,dd);
  Extra_StopManager(dd);
  return vNodes;
}

Assistant:

Vec_Int_t * Llb_ManDeriveConstraints( Aig_Man_t * p )
{
    DdManager * dd;
    Vec_Int_t * vNodes;
    if ( Saig_ManPoNum(p) != 1 )
    {
        printf( "The AIG has %d property outputs.\n", Saig_ManPoNum(p) );
        return NULL;
    }
    assert( Saig_ManPoNum(p) == 1 );
    dd = Llb_ManConstructGlobalBdds( p );
    vNodes = Llb_ManComputeBaseCase( p, dd );
    if ( Llb_ManCountEntries(vNodes) > 0 )
        Llb_ManComputeIndCase( p, dd, vNodes );
    if ( Llb_ManCountEntries(vNodes) == 0 )
        Vec_IntFreeP( &vNodes );
    Llb_ManDerefenceBdds( p, dd );
    Extra_StopManager( dd );
    return vNodes;
}